

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

xmlXIncludeCtxtPtr xmlXIncludeNewContext(xmlDocPtr doc)

{
  xmlXIncludeCtxtPtr pxVar1;
  
  if (doc == (xmlDocPtr)0x0) {
    pxVar1 = (xmlXIncludeCtxtPtr)0x0;
  }
  else {
    pxVar1 = (xmlXIncludeCtxtPtr)(*xmlMalloc)(0x68);
    if (pxVar1 == (xmlXIncludeCtxtPtr)0x0) {
      pxVar1 = (xmlXIncludeCtxtPtr)0x0;
      xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)0x0,(xmlNodePtr)doc,"creating XInclude context");
    }
    else {
      pxVar1->incTotal = 0;
      pxVar1->depth = 0;
      pxVar1->isStream = 0;
      pxVar1->base = (xmlChar *)0x0;
      pxVar1->_private = (void *)0x0;
      pxVar1->nbErrors = 0;
      pxVar1->legacy = 0;
      *(undefined8 *)&pxVar1->parseFlags = 0;
      pxVar1->urlNr = 0;
      pxVar1->urlMax = 0;
      pxVar1->urlTab = (xmlXIncludeDoc *)0x0;
      pxVar1->txtNr = 0;
      pxVar1->txtMax = 0;
      pxVar1->txtTab = (xmlXIncludeTxt *)0x0;
      pxVar1->doc = doc;
      pxVar1->incNr = 0;
      pxVar1->incMax = 0;
      pxVar1->incTab = (xmlXIncludeRefPtr *)0x0;
    }
  }
  return pxVar1;
}

Assistant:

xmlXIncludeCtxtPtr
xmlXIncludeNewContext(xmlDocPtr doc) {
    xmlXIncludeCtxtPtr ret;

#ifdef DEBUG_XINCLUDE
    xmlGenericError(xmlGenericErrorContext, "New context\n");
#endif
    if (doc == NULL)
	return(NULL);
    ret = (xmlXIncludeCtxtPtr) xmlMalloc(sizeof(xmlXIncludeCtxt));
    if (ret == NULL) {
	xmlXIncludeErrMemory(NULL, (xmlNodePtr) doc,
	                     "creating XInclude context");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlXIncludeCtxt));
    ret->doc = doc;
    ret->incNr = 0;
    ret->incMax = 0;
    ret->incTab = NULL;
    ret->nbErrors = 0;
    return(ret);
}